

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serverbrowser.cpp
# Opt level: O1

void __thiscall CServerBrowser::LoadServerlist(CServerBrowser *this)

{
  json_object_entry *pjVar1;
  int iVar2;
  undefined4 extraout_var;
  long lVar3;
  char *pcVar4;
  json_value *value;
  _json_value *p_Var5;
  _json_value *p_Var6;
  ulong uVar7;
  uint size;
  long in_FS_OFFSET;
  json_settings JsonSettings;
  NETADDR Addr;
  char aError [256];
  json_settings local_188;
  NETADDR local_158;
  char local_138 [256];
  long local_38;
  IOHANDLE io;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = (*(this->m_pStorage->super_IInterface)._vptr_IInterface[4])
                    (this->m_pStorage,"serverlist.json",1,0xffffffff,0,0,0,0);
  io = (IOHANDLE)CONCAT44(extraout_var,iVar2);
  if (io != (IOHANDLE)0x0) {
    lVar3 = io_length(io);
    size = (uint)lVar3;
    pcVar4 = (char *)mem_alloc(size);
    io_read(io,pcVar4,size);
    io_close(io);
    mem_zero(&local_188,0x30);
    value = json_parse_ex(&local_188,pcVar4,(long)(int)size,local_138);
    mem_free(pcVar4);
    if (value == (json_value *)0x0) {
      (*(this->m_pConsole->super_IInterface)._vptr_IInterface[0x19])
                (this->m_pConsole,1,"serverlist.json",local_138,0);
    }
    else {
      p_Var6 = &json_value_none;
      if ((value->type == json_object) && (uVar7 = (ulong)(value->u).string.length, uVar7 != 0)) {
        pjVar1 = (value->u).object.values;
        lVar3 = 0;
        do {
          iVar2 = strcmp(*(char **)((long)&pjVar1->name + lVar3),"serverlist");
          if (iVar2 == 0) {
            p_Var6 = *(_json_value **)((long)&pjVar1->value + lVar3);
            break;
          }
          lVar3 = lVar3 + 0x18;
        } while (uVar7 * 0x18 != lVar3);
      }
      if ((p_Var6->u).boolean != 0) {
        uVar7 = 0;
        do {
          p_Var5 = &json_value_none;
          if ((-1 < (int)uVar7) && (p_Var5 = &json_value_none, p_Var6->type == json_array)) {
            p_Var5 = *(_json_value **)((p_Var6->u).string.ptr + uVar7 * 8);
          }
          if (p_Var5->type == json_string) {
            local_158.type = 0;
            local_158.ip[0] = '\0';
            local_158.ip[1] = '\0';
            local_158.ip[2] = '\0';
            local_158.ip[3] = '\0';
            local_158.ip[4] = '\0';
            local_158.ip[5] = '\0';
            local_158.ip[6] = '\0';
            local_158.ip[7] = '\0';
            local_158.ip[8] = '\0';
            local_158.ip[9] = '\0';
            local_158.ip[10] = '\0';
            local_158.ip[0xb] = '\0';
            local_158.ip[0xc] = '\0';
            local_158.ip[0xd] = '\0';
            local_158.ip[0xe] = '\0';
            local_158.ip[0xf] = '\0';
            local_158.port = 0;
            local_158.reserved = 0;
            p_Var5 = &json_value_none;
            if (((-1 < (int)uVar7) && (p_Var5 = &json_value_none, p_Var6->type == json_array)) &&
               (p_Var5 = &json_value_none, uVar7 < (p_Var6->u).string.length)) {
              p_Var5 = *(_json_value **)((p_Var6->u).string.ptr + uVar7 * 8);
            }
            pcVar4 = "";
            if (p_Var5->type == json_string) {
              pcVar4 = (p_Var5->u).string.ptr;
            }
            iVar2 = net_addr_from_str(&local_158,pcVar4);
            if (iVar2 == 0) {
              Set(this,&local_158,1,-1,(CServerInfo *)0x0);
            }
          }
          uVar7 = uVar7 + 1;
        } while (uVar7 < (p_Var6->u).string.length);
      }
      json_value_free(value);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CServerBrowser::LoadServerlist()
{
	// read file data into buffer
	IOHANDLE File = Storage()->OpenFile(s_pFilename, IOFLAG_READ, IStorage::TYPE_ALL);
	if(!File)
		return;
	int FileSize = (int)io_length(File);
	char *pFileData = (char *)mem_alloc(FileSize);
	io_read(File, pFileData, FileSize);
	io_close(File);

	// parse json data
	json_settings JsonSettings;
	mem_zero(&JsonSettings, sizeof(JsonSettings));
	char aError[256];
	json_value *pJsonData = json_parse_ex(&JsonSettings, pFileData, FileSize, aError);
	mem_free(pFileData);

	if(pJsonData == 0)
	{
		Console()->Print(IConsole::OUTPUT_LEVEL_ADDINFO, s_pFilename, aError);
		return;
	}

	// extract server list
	const json_value &rEntry = (*pJsonData)["serverlist"];
	for(unsigned i = 0; i < rEntry.u.array.length; ++i)
	{
		if(rEntry[i].type == json_string)
		{
			NETADDR Addr = { 0 };
			if(!net_addr_from_str(&Addr, rEntry[i]))
				Set(Addr, SET_MASTER_ADD, -1, 0);
		}
	}

	// clean up
	json_value_free(pJsonData);
}